

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

ListBuilder *
capnp::_::WireHelpers::getWritableStructListPointer
          (ListBuilder *__return_storage_ptr__,WirePointer *origRef,word *origRefTarget,
          SegmentBuilder *origSegment,CapTableBuilder *capTable,StructSize elementSize,
          word *defaultValue,BuilderArena *orphanArena)

{
  undefined8 this;
  bool bVar1;
  BitsPerElementTableType BVar2;
  PointersPerElementN<1> PVar3;
  WiderType<Decay<unsigned_short_&>,_Decay<unsigned_int>_> WVar4;
  uint uVar5;
  ulong uVar6;
  unsigned_long uVar7;
  WirePointer *pWVar8;
  unsigned_short *puVar9;
  uint *puVar10;
  WordCount64 value;
  uint uVar11;
  anon_class_1_0_00000001 local_261;
  unsigned_long local_260;
  unsigned_long oldSize_2;
  Iterator local_250;
  uint i_2;
  Iterator __end5_1;
  Iterator __begin5_1;
  Range<unsigned_int> *__range5_1;
  uint oldByteStep;
  uint newByteStep;
  byte *src_2;
  byte *dst_2;
  Iterator local_218;
  uint i_1;
  Iterator __end5;
  Iterator __begin5;
  Range<unsigned_int> *__range5;
  WirePointer *src_1;
  WirePointer *dst_1;
  WirePointer *tag;
  word *newPtr_1;
  unsigned_long local_1d8;
  unsigned_long totalWords;
  uint newStep_1;
  StructPointerCount local_1c4;
  StructDataWordCount local_1c2;
  StructPointerCount newPointerCount_1;
  StructDataWordCount newDataSize_1;
  Fault f_2;
  ElementSize *local_1b0;
  undefined1 local_1a8 [8];
  DebugComparison<capnp::ElementSize_&,_capnp::ElementSize> _kjCondition_2;
  ElementCountN<29> elementCount_1;
  uint oldStep_1;
  uint oldPointerCount_1;
  uint oldDataSize_1;
  unsigned_long oldSize_1;
  Iterator local_158;
  Iterator local_156;
  Range<unsigned_short> RStack_154;
  unsigned_short j;
  Iterator __end4;
  Iterator __begin4;
  Range<unsigned_short> *__range4;
  WirePointer *oldPointerSection;
  WirePointer *newPointerSection;
  Iterator local_130;
  uint i;
  Iterator __end3;
  Iterator __begin3;
  Range<unsigned_int> *__range3;
  word *dst;
  word *src;
  WirePointer *newTag;
  word *newPtr;
  unsigned_long local_f0;
  unsigned_long totalSize;
  WiderType<Decay<unsigned_short_&>,_Decay<unsigned_short_&>_> local_e0;
  ushort local_de;
  uint newStep;
  WiderType<Decay<unsigned_short_&>,_Decay<unsigned_short_&>_> newPointerCount;
  WiderType<Decay<unsigned_short_&>,_Decay<unsigned_short_&>_> newDataSize;
  ListElementCount elementCount;
  uint oldStep;
  unsigned_short oldPointerCount;
  unsigned_short oldDataSize;
  Fault f_1;
  Kind local_c0;
  DebugExpression<capnp::_::WirePointer::Kind> local_bc;
  undefined1 local_b8 [8];
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition_1;
  WirePointer *oldTag;
  ElementSize oldSize;
  Fault local_80;
  Fault f;
  Kind local_70;
  DebugExpression<capnp::_::WirePointer::Kind> local_6c;
  undefined1 local_68 [8];
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition;
  word *oldPtr;
  SegmentBuilder *oldSegment;
  WirePointer *oldRef;
  CapTableBuilder *capTable_local;
  SegmentBuilder *origSegment_local;
  word *origRefTarget_local;
  WirePointer *origRef_local;
  StructSize elementSize_local;
  
  oldRef = (WirePointer *)capTable;
  capTable_local = (CapTableBuilder *)origSegment;
  origSegment_local = (SegmentBuilder *)origRefTarget;
  origRefTarget_local = (word *)origRef;
  origRef_local._4_4_ = elementSize;
  bVar1 = WirePointer::isNull(origRef);
  if (bVar1) goto LAB_001490c6;
  do {
    oldSegment = (SegmentBuilder *)origRefTarget_local;
    oldPtr = (word *)capTable_local;
    _kjCondition._24_8_ =
         followFars((WirePointer **)&oldSegment,(word *)origSegment_local,(SegmentBuilder **)&oldPtr
                   );
    local_70 = WirePointer::kind((WirePointer *)oldSegment);
    local_6c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_70);
    f.exception._4_4_ = 1;
    kj::_::DebugExpression<capnp::_::WirePointer::Kind>::operator==
              ((DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)local_68
               ,&local_6c,(Kind *)((long)&f.exception + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_68);
    if (bVar1) {
      oldTag._3_1_ = WirePointer::ListRef::elementSize
                               ((ListRef *)((long)&(oldSegment->super_SegmentReader).arena + 4));
      this = _kjCondition._24_8_;
      if (oldTag._3_1_ == INLINE_COMPOSITE) {
        _kjCondition_1.result = _kjCondition.result;
        _kjCondition_1._25_7_ = _kjCondition._25_7_;
        _kjCondition._24_8_ = _kjCondition._24_8_ + 8;
        local_c0 = WirePointer::kind((WirePointer *)this);
        local_bc = kj::_::DebugExpressionStart::operator<<
                             ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_c0);
        f_1.exception._4_4_ = 0;
        kj::_::DebugExpression<capnp::_::WirePointer::Kind>::operator==
                  ((DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                   local_b8,&local_bc,(Kind *)((long)&f_1.exception + 4));
        bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_b8);
        if (bVar1) {
          elementCount._2_2_ =
               DirectWireValue<unsigned_short>::get
                         ((DirectWireValue<unsigned_short> *)(_kjCondition_1._24_8_ + 4));
          elementCount._0_2_ =
               DirectWireValue<unsigned_short>::get
                         ((DirectWireValue<unsigned_short> *)(_kjCondition_1._24_8_ + 6));
          _newPointerCount = (uint)elementCount._2_2_ + (uint)(unsigned_short)elementCount;
          newStep = WirePointer::inlineCompositeListElementCount
                              ((WirePointer *)_kjCondition_1._24_8_);
          if ((origRef_local._4_2_ <= elementCount._2_2_) &&
             (origRef_local._6_2_ <= (unsigned_short)elementCount)) {
            ListBuilder::ListBuilder
                      (__return_storage_ptr__,(SegmentBuilder *)oldPtr,(CapTableBuilder *)oldRef,
                       (void *)_kjCondition._24_8_,_newPointerCount << 6,newStep,
                       (uint)elementCount._2_2_ << 6,(unsigned_short)elementCount,INLINE_COMPOSITE);
            return __return_storage_ptr__;
          }
          local_de = kj::max<unsigned_short&,unsigned_short&>
                               ((unsigned_short *)((long)&elementCount + 2),
                                (unsigned_short *)((long)&origRef_local + 4));
          local_e0 = kj::max<unsigned_short&,unsigned_short&>
                               ((unsigned_short *)&elementCount,
                                (unsigned_short *)((long)&origRef_local + 6));
          totalSize._4_4_ = (uint)local_de + (uint)local_e0;
          uVar6 = (ulong)totalSize._4_4_;
          uVar7 = upgradeBound<unsigned_long,unsigned_int>(newStep);
          local_f0 = assertMax<536870910u,unsigned_long,capnp::_::WireHelpers::getWritableStructListPointer(capnp::_::WirePointer*,capnp::word*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,capnp::_::StructSize,capnp::word_const*,capnp::_::BuilderArena*)::_lambda()_1_>
                               (uVar6 * uVar7,(anon_class_1_0_00000001 *)((long)&newPtr + 7));
          zeroPointerAndFars((SegmentBuilder *)capTable_local,(WirePointer *)origRefTarget_local);
          pWVar8 = (WirePointer *)
                   allocate((WirePointer **)&origRefTarget_local,(SegmentBuilder **)&capTable_local,
                            (CapTableBuilder *)oldRef,(int)local_f0 + 1,LIST,orphanArena);
          WirePointer::ListRef::setInlineComposite
                    ((ListRef *)((long)&origRefTarget_local->content + 4),(WordCountN<29>)local_f0);
          WirePointer::setKindAndInlineCompositeListElementCount(pWVar8,STRUCT,newStep);
          WirePointer::StructRef::set(&(pWVar8->field_1).structRef,local_de,local_e0);
          dst = (word *)_kjCondition._24_8_;
          ___end3 = kj::zeroTo<unsigned_int>(newStep);
          i = (uint)kj::Range<unsigned_int>::begin((Range<unsigned_int> *)&__end3);
          local_130 = kj::Range<unsigned_int>::end((Range<unsigned_int> *)&__end3);
          __range3 = (Range<unsigned_int> *)(pWVar8 + 1);
          while (bVar1 = kj::Range<unsigned_int>::Iterator::operator==((Iterator *)&i,&local_130),
                ((bVar1 ^ 0xffU) & 1) != 0) {
            kj::Range<unsigned_int>::Iterator::operator*((Iterator *)&i);
            copyMemory((word *)__range3,dst,(uint)elementCount._2_2_);
            uVar5 = (uint)local_de;
            uVar11 = (uint)elementCount._2_2_;
            RStack_154 = kj::zeroTo<unsigned_short>((unsigned_short)elementCount);
            ___end4 = &stack0xfffffffffffffeac;
            local_156 = kj::Range<unsigned_short>::begin(___end4);
            local_158 = kj::Range<unsigned_short>::end(___end4);
            while (bVar1 = kj::Range<unsigned_short>::Iterator::operator==(&local_156,&local_158),
                  ((bVar1 ^ 0xffU) & 1) != 0) {
              puVar9 = kj::Range<unsigned_short>::Iterator::operator*(&local_156);
              oldSize_1._6_2_ = *puVar9;
              transferPointer((SegmentBuilder *)capTable_local,
                              (WirePointer *)
                              (__range3 + (long)(int)uVar5 + (long)(int)(uint)oldSize_1._6_2_),
                              (SegmentBuilder *)oldPtr,
                              (WirePointer *)
                              (dst + (long)(int)uVar11 + (long)(int)(uint)oldSize_1._6_2_));
              kj::Range<unsigned_short>::Iterator::operator++(&local_156);
            }
            __range3 = __range3 + totalSize._4_4_;
            dst = dst + _newPointerCount;
            kj::Range<unsigned_int>::Iterator::operator++((Iterator *)&i);
          }
          uVar6 = (ulong)_newPointerCount;
          uVar7 = upgradeBound<unsigned_long,unsigned_int>(newStep);
          _oldDataSize_1 =
               assertMax<536870910u,unsigned_long,capnp::_::WireHelpers::getWritableStructListPointer(capnp::_::WirePointer*,capnp::word*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,capnp::_::StructSize,capnp::word_const*,capnp::_::BuilderArena*)::_lambda()_2_>
                         (uVar6 * uVar7,(anon_class_1_0_00000001 *)((long)&oldPointerCount_1 + 3));
          zeroMemory((word *)(_kjCondition._24_8_ + -8),(int)_oldDataSize_1 + 1);
          ListBuilder::ListBuilder
                    (__return_storage_ptr__,(SegmentBuilder *)capTable_local,
                     (CapTableBuilder *)oldRef,(Range<unsigned_int> *)(pWVar8 + 1),
                     totalSize._4_4_ << 6,newStep,(uint)local_de << 6,local_e0,INLINE_COMPOSITE);
          return __return_storage_ptr__;
        }
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[62]>
                  ((Fault *)&oldStep,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x5c7,FAILED,"oldTag->kind() == WirePointer::STRUCT",
                   "_kjCondition,\"INLINE_COMPOSITE list with non-STRUCT elements not supported.\"",
                   (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                   local_b8,(char (*) [62])
                            "INLINE_COMPOSITE list with non-STRUCT elements not supported.");
        kj::_::Debug::Fault::~Fault((Fault *)&oldStep);
      }
      else {
        BVar2 = dataBitsPerElement(oldTag._3_1_);
        PVar3 = pointersPerElement(oldTag._3_1_);
        _kjCondition_2._36_4_ =
             WirePointer::ListRef::elementCount
                       ((ListRef *)((long)&(oldSegment->super_SegmentReader).arena + 4));
        if (oldTag._3_1_ == VOID) {
          _kjCondition_2._32_4_ = origRef_local._4_4_;
          initStructListPointer
                    (__return_storage_ptr__,(WirePointer *)origRefTarget_local,
                     (SegmentBuilder *)capTable_local,(CapTableBuilder *)oldRef,
                     _kjCondition_2._36_4_,origRef_local._4_4_,(BuilderArena *)0x0);
          return __return_storage_ptr__;
        }
        local_1b0 = (ElementSize *)
                    kj::_::DebugExpressionStart::operator<<
                              ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                               (ElementSize *)((long)&oldTag + 3));
        f_2.exception._7_1_ = 1;
        kj::_::DebugExpression<capnp::ElementSize&>::operator!=
                  ((DebugComparison<capnp::ElementSize_&,_capnp::ElementSize> *)local_1a8,
                   (DebugExpression<capnp::ElementSize&> *)&local_1b0,
                   (ElementSize *)((long)&f_2.exception + 7));
        bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1a8);
        if (bVar1) {
          local_1c2 = origRef_local._4_2_;
          local_1c4 = origRef_local._6_2_;
          if (oldTag._3_1_ == POINTER) {
            newStep_1 = 1;
            WVar4 = kj::max<unsigned_short&,unsigned_int>(&local_1c4,&newStep_1);
            local_1c4 = (StructPointerCount)WVar4;
          }
          else {
            totalWords._4_4_ = 1;
            WVar4 = kj::max<unsigned_short&,unsigned_int>
                              (&local_1c2,(uint *)((long)&totalWords + 4));
            local_1c2 = (StructDataWordCount)WVar4;
          }
          totalWords._0_4_ = (uint)local_1c2 + (uint)local_1c4;
          uVar6 = (ulong)(uint)totalWords;
          uVar7 = upgradeBound<unsigned_long,unsigned_int>(_kjCondition_2._36_4_);
          local_1d8 = assertMax<536870910u,unsigned_long,capnp::_::WireHelpers::getWritableStructListPointer(capnp::_::WirePointer*,capnp::word*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,capnp::_::StructSize,capnp::word_const*,capnp::_::BuilderArena*)::_lambda()_3_>
                                (uVar6 * uVar7,(anon_class_1_0_00000001 *)((long)&newPtr_1 + 7));
          zeroPointerAndFars((SegmentBuilder *)capTable_local,(WirePointer *)origRefTarget_local);
          pWVar8 = (WirePointer *)
                   allocate((WirePointer **)&origRefTarget_local,(SegmentBuilder **)&capTable_local,
                            (CapTableBuilder *)oldRef,(int)local_1d8 + 1,LIST,orphanArena);
          WirePointer::ListRef::setInlineComposite
                    ((ListRef *)((long)&origRefTarget_local->content + 4),(WordCountN<29>)local_1d8)
          ;
          WirePointer::setKindAndInlineCompositeListElementCount
                    (pWVar8,STRUCT,_kjCondition_2._36_4_);
          WirePointer::StructRef::set(&(pWVar8->field_1).structRef,local_1c2,local_1c4);
          pWVar8 = pWVar8 + 1;
          if (oldTag._3_1_ == POINTER) {
            src_1 = pWVar8 + (int)(uint)local_1c2;
            __range5 = (Range<unsigned_int> *)_kjCondition._24_8_;
            ___end5 = kj::zeroTo<unsigned_int>(_kjCondition_2._36_4_);
            i_1 = (uint)kj::Range<unsigned_int>::begin((Range<unsigned_int> *)&__end5);
            local_218 = kj::Range<unsigned_int>::end((Range<unsigned_int> *)&__end5);
            while (bVar1 = kj::Range<unsigned_int>::Iterator::operator==
                                     ((Iterator *)&i_1,&local_218), ((bVar1 ^ 0xffU) & 1) != 0) {
              kj::Range<unsigned_int>::Iterator::operator*((Iterator *)&i_1);
              transferPointer((SegmentBuilder *)capTable_local,src_1,(SegmentBuilder *)oldPtr,
                              (WirePointer *)__range5);
              src_1 = src_1 + (uint)totalWords;
              __range5 = __range5 + 1;
              kj::Range<unsigned_int>::Iterator::operator++((Iterator *)&i_1);
            }
          }
          else {
            _oldByteStep = (byte *)_kjCondition._24_8_;
            uVar5 = (uint)totalWords << 3;
            ___end5_1 = kj::zeroTo<unsigned_int>(_kjCondition_2._36_4_);
            i_2 = (uint)kj::Range<unsigned_int>::begin((Range<unsigned_int> *)&__end5_1);
            local_250 = kj::Range<unsigned_int>::end((Range<unsigned_int> *)&__end5_1);
            src_2 = (byte *)pWVar8;
            while (bVar1 = kj::Range<unsigned_int>::Iterator::operator==
                                     ((Iterator *)&i_2,&local_250), ((bVar1 ^ 0xffU) & 1) != 0) {
              puVar10 = kj::Range<unsigned_int>::Iterator::operator*((Iterator *)&i_2);
              oldSize_2._4_4_ = *puVar10;
              copyMemory(src_2,_oldByteStep,BVar2 >> 3);
              _oldByteStep = _oldByteStep + (BVar2 >> 3);
              src_2 = src_2 + uVar5;
              kj::Range<unsigned_int>::Iterator::operator++((Iterator *)&i_2);
            }
          }
          uVar7 = upgradeBound<unsigned_long,unsigned_int>(_kjCondition_2._36_4_);
          value = roundBitsUpToWords((BVar2 + PVar3 * 0x40) * uVar7);
          local_260 = assertMax<536870910u,unsigned_long,capnp::_::WireHelpers::getWritableStructListPointer(capnp::_::WirePointer*,capnp::word*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,capnp::_::StructSize,capnp::word_const*,capnp::_::BuilderArena*)::_lambda()_4_>
                                (value,&local_261);
          zeroMemory((word *)_kjCondition._24_8_,(WordCountN<29>)local_260);
          ListBuilder::ListBuilder
                    (__return_storage_ptr__,(SegmentBuilder *)capTable_local,
                     (CapTableBuilder *)oldRef,pWVar8,(uint)totalWords << 6,_kjCondition_2._36_4_,
                     (uint)local_1c2 << 6,local_1c4,INLINE_COMPOSITE);
          return __return_storage_ptr__;
        }
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::ElementSize&,capnp::ElementSize>&,char_const(&)[123]>
                  ((Fault *)&stack0xfffffffffffffe40,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x61b,FAILED,"oldSize != ElementSize::BIT",
                   "_kjCondition,\"Schema mismatch: Found bit list where struct list was expected; upgrading boolean \" \"lists to structs is no longer supported.\""
                   ,(DebugComparison<capnp::ElementSize_&,_capnp::ElementSize> *)local_1a8,
                   (char (*) [123])
                   "Schema mismatch: Found bit list where struct list was expected; upgrading boolean lists to structs is no longer supported."
                  );
        kj::_::Debug::Fault::~Fault((Fault *)&stack0xfffffffffffffe40);
      }
    }
    else {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[85]>
                (&local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x5bb,FAILED,"oldRef->kind() == WirePointer::LIST",
                 "_kjCondition,\"Schema mismatch: Called getList{Field,Element}() but existing pointer is not a \" \"list.\""
                 ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                  local_68,
                 (char (*) [85])
                 "Schema mismatch: Called getList{Field,Element}() but existing pointer is not a list."
                );
      kj::_::Debug::Fault::~Fault(&local_80);
    }
LAB_001490c6:
    if ((defaultValue == (word *)0x0) ||
       (bVar1 = WirePointer::isNull((WirePointer *)defaultValue), bVar1)) {
      ListBuilder::ListBuilder(__return_storage_ptr__,INLINE_COMPOSITE);
      return __return_storage_ptr__;
    }
    origSegment_local =
         (SegmentBuilder *)
         copyMessage((SegmentBuilder **)&capTable_local,(CapTableBuilder *)oldRef,
                     (WirePointer **)&origRefTarget_local,(WirePointer *)defaultValue);
    defaultValue = (word *)0x0;
  } while( true );
}

Assistant:

static KJ_ALWAYS_INLINE(ListBuilder getWritableStructListPointer(
      WirePointer* origRef, word* origRefTarget,
      SegmentBuilder* origSegment, CapTableBuilder* capTable,
      StructSize elementSize, const word* defaultValue, BuilderArena* orphanArena = nullptr)) {
    if (origRef->isNull()) {
    useDefault:
      if (defaultValue == nullptr ||
          reinterpret_cast<const WirePointer*>(defaultValue)->isNull()) {
        return ListBuilder(ElementSize::INLINE_COMPOSITE);
      }
      origRefTarget = copyMessage(
          origSegment, capTable, origRef, reinterpret_cast<const WirePointer*>(defaultValue));
      defaultValue = nullptr;  // If the default value is itself invalid, don't use it again.
    }

    // We must verify that the pointer has the right size and potentially upgrade it if not.

    WirePointer* oldRef = origRef;
    SegmentBuilder* oldSegment = origSegment;
    word* oldPtr = followFars(oldRef, origRefTarget, oldSegment);

    KJ_REQUIRE(oldRef->kind() == WirePointer::LIST,
               "Schema mismatch: Called getList{Field,Element}() but existing pointer is not a "
               "list.") {
      goto useDefault;
    }

    ElementSize oldSize = oldRef->listRef.elementSize();

    if (oldSize == ElementSize::INLINE_COMPOSITE) {
      // Existing list is INLINE_COMPOSITE, but we need to verify that the sizes match.

      WirePointer* oldTag = reinterpret_cast<WirePointer*>(oldPtr);
      oldPtr += POINTER_SIZE_IN_WORDS;
      KJ_REQUIRE(oldTag->kind() == WirePointer::STRUCT,
                 "INLINE_COMPOSITE list with non-STRUCT elements not supported.") {
        goto useDefault;
      }

      auto oldDataSize = oldTag->structRef.dataSize.get();
      auto oldPointerCount = oldTag->structRef.ptrCount.get();
      auto oldStep = (oldDataSize + oldPointerCount * WORDS_PER_POINTER) / ELEMENTS;

      auto elementCount = oldTag->inlineCompositeListElementCount();

      if (oldDataSize >= elementSize.data && oldPointerCount >= elementSize.pointers) {
        // Old size is at least as large as we need.  Ship it.
        return ListBuilder(oldSegment, capTable, oldPtr, oldStep * BITS_PER_WORD, elementCount,
                           oldDataSize * BITS_PER_WORD, oldPointerCount,
                           ElementSize::INLINE_COMPOSITE);
      }

      // The structs in this list are smaller than expected, probably written using an older
      // version of the protocol.  We need to make a copy and expand them.

      auto newDataSize = kj::max(oldDataSize, elementSize.data);
      auto newPointerCount = kj::max(oldPointerCount, elementSize.pointers);
      auto newStep = (newDataSize + newPointerCount * WORDS_PER_POINTER) / ELEMENTS;

      auto totalSize = assertMax<kj::maxValueForBits<SEGMENT_WORD_COUNT_BITS>() - 1>(
            newStep * upgradeBound<uint64_t>(elementCount),
            []() { KJ_FAIL_REQUIRE("total size of struct list is larger than max segment size"); });

      // Don't let allocate() zero out the object just yet.
      zeroPointerAndFars(origSegment, origRef);

      word* newPtr = allocate(origRef, origSegment, capTable, totalSize + POINTER_SIZE_IN_WORDS,
                              WirePointer::LIST, orphanArena);
      origRef->listRef.setInlineComposite(totalSize);

      WirePointer* newTag = reinterpret_cast<WirePointer*>(newPtr);
      newTag->setKindAndInlineCompositeListElementCount(WirePointer::STRUCT, elementCount);
      newTag->structRef.set(newDataSize, newPointerCount);
      newPtr += POINTER_SIZE_IN_WORDS;

      word* src = oldPtr;
      word* dst = newPtr;
      for (auto i KJ_UNUSED: kj::zeroTo(elementCount)) {
        // Copy data section.
        copyMemory(dst, src, oldDataSize);

        // Copy pointer section.
        WirePointer* newPointerSection = reinterpret_cast<WirePointer*>(dst + newDataSize);
        WirePointer* oldPointerSection = reinterpret_cast<WirePointer*>(src + oldDataSize);
        for (auto j: kj::zeroTo(oldPointerCount)) {
          transferPointer(origSegment, newPointerSection + j, oldSegment, oldPointerSection + j);
        }

        dst += newStep * (ONE * ELEMENTS);
        src += oldStep * (ONE * ELEMENTS);
      }

      auto oldSize = assertMax<kj::maxValueForBits<SEGMENT_WORD_COUNT_BITS>() - 1>(
            oldStep * upgradeBound<uint64_t>(elementCount),
            []() { KJ_FAIL_ASSERT("old size overflows but new size doesn't?"); });

      // Zero out old location.  See explanation in getWritableStructPointer().
      // Make sure to include the tag word.
      zeroMemory(oldPtr - POINTER_SIZE_IN_WORDS, oldSize + POINTER_SIZE_IN_WORDS);

      return ListBuilder(origSegment, capTable, newPtr, newStep * BITS_PER_WORD, elementCount,
                         newDataSize * BITS_PER_WORD, newPointerCount,
                         ElementSize::INLINE_COMPOSITE);
    } else {
      // We're upgrading from a non-struct list.

      auto oldDataSize = dataBitsPerElement(oldSize) * ELEMENTS;
      auto oldPointerCount = pointersPerElement(oldSize) * ELEMENTS;
      auto oldStep = (oldDataSize + oldPointerCount * BITS_PER_POINTER) / ELEMENTS;
      auto elementCount = oldRef->listRef.elementCount();

      if (oldSize == ElementSize::VOID) {
        // Nothing to copy, just allocate a new list.
        return initStructListPointer(origRef, origSegment, capTable, elementCount, elementSize);
      } else {
        // Upgrading to an inline composite list.

        KJ_REQUIRE(oldSize != ElementSize::BIT,
            "Schema mismatch: Found bit list where struct list was expected; upgrading boolean "
            "lists to structs is no longer supported.") {
          goto useDefault;
        }

        auto newDataSize = elementSize.data;
        auto newPointerCount = elementSize.pointers;

        if (oldSize == ElementSize::POINTER) {
          newPointerCount = kj::max(newPointerCount, ONE * POINTERS);
        } else {
          // Old list contains data elements, so we need at least 1 word of data.
          newDataSize = kj::max(newDataSize, ONE * WORDS);
        }

        auto newStep = (newDataSize + newPointerCount * WORDS_PER_POINTER) / ELEMENTS;
        auto totalWords = assertMax<kj::maxValueForBits<SEGMENT_WORD_COUNT_BITS>() - 1>(
              newStep * upgradeBound<uint64_t>(elementCount),
              []() {KJ_FAIL_REQUIRE("total size of struct list is larger than max segment size");});

        // Don't let allocate() zero out the object just yet.
        zeroPointerAndFars(origSegment, origRef);

        word* newPtr = allocate(origRef, origSegment, capTable, totalWords + POINTER_SIZE_IN_WORDS,
                                WirePointer::LIST, orphanArena);
        origRef->listRef.setInlineComposite(totalWords);

        WirePointer* tag = reinterpret_cast<WirePointer*>(newPtr);
        tag->setKindAndInlineCompositeListElementCount(WirePointer::STRUCT, elementCount);
        tag->structRef.set(newDataSize, newPointerCount);
        newPtr += POINTER_SIZE_IN_WORDS;

        if (oldSize == ElementSize::POINTER) {
          WirePointer* dst = reinterpret_cast<WirePointer*>(newPtr + newDataSize);
          WirePointer* src = reinterpret_cast<WirePointer*>(oldPtr);
          for (auto i KJ_UNUSED: kj::zeroTo(elementCount)) {
            transferPointer(origSegment, dst, oldSegment, src);
            dst += newStep / WORDS_PER_POINTER * (ONE * ELEMENTS);
            ++src;
          }
        } else {
          byte* dst = reinterpret_cast<byte*>(newPtr);
          byte* src = reinterpret_cast<byte*>(oldPtr);
          auto newByteStep = newStep * (ONE * ELEMENTS) * BYTES_PER_WORD;
          auto oldByteStep = oldDataSize / BITS_PER_BYTE;
          for (auto i KJ_UNUSED: kj::zeroTo(elementCount)) {
            copyMemory(dst, src, oldByteStep);
            src += oldByteStep;
            dst += newByteStep;
          }
        }

        auto oldSize = assertMax<kj::maxValueForBits<SEGMENT_WORD_COUNT_BITS>() - 1>(
              roundBitsUpToWords(oldStep * upgradeBound<uint64_t>(elementCount)),
              []() { KJ_FAIL_ASSERT("old size overflows but new size doesn't?"); });

        // Zero out old location.  See explanation in getWritableStructPointer().
        zeroMemory(oldPtr, oldSize);

        return ListBuilder(origSegment, capTable, newPtr, newStep * BITS_PER_WORD, elementCount,
                           newDataSize * BITS_PER_WORD, newPointerCount,
                           ElementSize::INLINE_COMPOSITE);
      }
    }
  }